

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.h
# Opt level: O0

void av1_k_means(int16_t *data,int16_t *centroids,uint8_t *indices,int n,int k,int dim,int max_itr)

{
  int in_R9D;
  int in_stack_00001024;
  int in_stack_00001028;
  int in_stack_0000102c;
  undefined4 in_stack_00001030;
  int in_stack_00001034;
  int in_stack_00001038;
  int in_stack_0000103c;
  int16_t *in_stack_00001040;
  int16_t *in_stack_00001048;
  int16_t *in_stack_00001050;
  
  if (in_R9D == 1) {
    av1_k_means_dim1(in_stack_00001040,(int16_t *)CONCAT44(in_stack_0000103c,in_stack_00001038),
                     (uint8_t *)CONCAT44(in_stack_00001034,in_stack_00001030),in_stack_0000102c,
                     in_stack_00001028,in_stack_00001024);
  }
  else if (in_R9D == 2) {
    av1_k_means_dim2(in_stack_00001050,in_stack_00001048,(uint8_t *)in_stack_00001040,
                     in_stack_0000103c,in_stack_00001038,in_stack_00001034);
  }
  return;
}

Assistant:

static inline void av1_k_means(const int16_t *data, int16_t *centroids,
                               uint8_t *indices, int n, int k, int dim,
                               int max_itr) {
  assert(n > 0);
  assert(k > 0);
  if (dim == 1) {
    AV1_K_MEANS_RENAME(av1_k_means, 1)(data, centroids, indices, n, k, max_itr);
  } else if (dim == 2) {
    AV1_K_MEANS_RENAME(av1_k_means, 2)(data, centroids, indices, n, k, max_itr);
  } else {
    assert(0 && "Untemplated k means dimension");
  }
}